

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMaterialShellKirchhoff::ChMaterialShellKirchhoff
          (ChMaterialShellKirchhoff *this,
          shared_ptr<chrono::fea::ChElasticityKirchhoff> *melasticity,
          shared_ptr<chrono::fea::ChPlasticityKirchhoff> *mplasticity)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  this->_vptr_ChMaterialShellKirchhoff = (_func_int **)&PTR__ChMaterialShellKirchhoff_00b53a70;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20 = (melasticity->
             super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_18._M_pi =
       (melasticity->
       super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
  }
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_20;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->elasticity).
              super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_18);
  ((this->elasticity).
   super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  section = this;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  peVar1 = (mplasticity->
           super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_28._M_pi =
       (mplasticity->
       super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->plasticity).
              super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_28);
  peVar1->section = this;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

ChMaterialShellKirchhoff::ChMaterialShellKirchhoff(std::shared_ptr<ChElasticityKirchhoff> melasticity,
												 std::shared_ptr<ChPlasticityKirchhoff> mplasticity) {
    this->SetElasticity(melasticity);
    this->SetPlasticity(mplasticity);
}